

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O3

void ngram_fwdflat_free_1ph(ngram_search_t *ngs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(ngs->base).n_words;
  if (0 < lVar2) {
    lVar3 = 0;
    iVar1 = 0;
    do {
      if (*(int *)((long)&((ngs->base).dict)->word->pronlen + lVar3) == 1) {
        hmm_deinit(&ngs->rhmm_1ph[iVar1].hmm);
        iVar1 = iVar1 + 1;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar2 * 0x20 != lVar3);
  }
  ckd_free(ngs->rhmm_1ph);
  ngs->rhmm_1ph = (root_chan_t *)0x0;
  ckd_free(ngs->single_phone_wid);
  return;
}

Assistant:

static void
ngram_fwdflat_free_1ph(ngram_search_t *ngs)
{
    int i, w;
    int n_words = ps_search_n_words(ngs);

    for (i = w = 0; w < n_words; ++w) {
        if (!dict_is_single_phone(ps_search_dict(ngs), w))
            continue;
        hmm_deinit(&ngs->rhmm_1ph[i].hmm);
        ++i;
    }
    ckd_free(ngs->rhmm_1ph);
    ngs->rhmm_1ph = NULL;
    ckd_free(ngs->single_phone_wid);
}